

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator+=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  Fad<float> *pFVar7;
  long lVar8;
  Fad<float> *pFVar9;
  
  lVar8 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar8) {
    pFVar7 = this->fElem;
    pFVar9 = pFVar7 + lVar8;
    do {
      uVar1 = (value->dx_).num_elts;
      uVar5 = (ulong)uVar1;
      if (uVar5 != 0) {
        uVar2 = (pFVar7->dx_).num_elts;
        pfVar3 = (value->dx_).ptr_to_data;
        if ((ulong)uVar2 == 0) {
          (pFVar7->dx_).num_elts = uVar1;
          uVar6 = uVar5 * 4;
          if ((int)uVar1 < 0) {
            uVar6 = 0xffffffffffffffff;
          }
          pfVar4 = (float *)operator_new__(uVar6);
          (pFVar7->dx_).ptr_to_data = pfVar4;
          if (0 < (int)uVar1) {
            uVar6 = 0;
            do {
              pfVar4[uVar6] = pfVar3[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
        }
        else if (0 < (int)uVar2) {
          pfVar4 = (pFVar7->dx_).ptr_to_data;
          uVar5 = 0;
          do {
            pfVar4[uVar5] = pfVar3[uVar5] + pfVar4[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
      }
      pFVar7->val_ = value->val_ + pFVar7->val_;
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 < pFVar9);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator+=(const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ += value;
    return( *this );
}